

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geoplg.cpp
# Opt level: O1

MeshHeader * __thiscall
rw::Geometry::allocateMeshes(Geometry *this,int32 numMeshes,uint32 numIndices,bool32 noIndices)

{
  short sVar1;
  int iVar2;
  MeshHeader *pMVar3;
  MeshHeader *pMVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  
  uVar5 = 0;
  uVar7 = numIndices * 2;
  if (noIndices != 0) {
    uVar7 = uVar5;
  }
  iVar2 = uVar7 + numMeshes * 0x18 + 0x10;
  pMVar3 = this->meshHeader;
  if (pMVar3 == (MeshHeader *)0x0) {
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geoplg.cpp line: 50"
    ;
    pMVar3 = (MeshHeader *)(*DAT_00149de8)(iVar2,0x3000f);
    pMVar3->flags = 0;
  }
  else {
    uVar5 = (uint)pMVar3->numMeshes;
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geoplg.cpp line: 46"
    ;
    pMVar3 = (MeshHeader *)(*DAT_00149df0)(pMVar3,iVar2,0x3000f);
  }
  this->meshHeader = pMVar3;
  pMVar3->numMeshes = (uint16)numMeshes;
  sVar1 = nextSerialNum + 1;
  pMVar3->serialNum = nextSerialNum;
  nextSerialNum = sVar1;
  pMVar3->totalIndices = numIndices;
  if ((numMeshes & 0xffffU) != 0) {
    pMVar4 = pMVar3 + 1;
    lVar6 = (long)pMVar3 + (long)numMeshes * 0x18 + 0x10;
    uVar7 = 0;
    do {
      if (uVar5 <= uVar7) {
        pMVar4[1].flags = 0;
        pMVar4[1].numMeshes = 0;
        pMVar4[1].serialNum = 0;
        pMVar4->totalIndices = 0;
      }
      if (noIndices == 0) {
        pMVar4->flags = (int)lVar6;
        pMVar4->numMeshes = (short)((ulong)lVar6 >> 0x20);
        pMVar4->serialNum = (short)((ulong)lVar6 >> 0x30);
        lVar6 = lVar6 + (ulong)pMVar4->totalIndices * 2;
      }
      else {
        pMVar4->flags = 0;
        pMVar4->numMeshes = 0;
        pMVar4->serialNum = 0;
      }
      pMVar4 = (MeshHeader *)&pMVar4[1].totalIndices;
      uVar7 = uVar7 + 1;
    } while ((numMeshes & 0xffffU) != uVar7);
  }
  return pMVar3;
}

Assistant:

MeshHeader*
Geometry::allocateMeshes(int32 numMeshes, uint32 numIndices, bool32 noIndices)
{
	uint32 sz;
	MeshHeader *mh;
	Mesh *m;
	uint16 *indices;
	int32 oldNumMeshes;
	int32 i;
	sz = sizeof(MeshHeader) + numMeshes*sizeof(Mesh);
	if(!noIndices)
		sz += numIndices*sizeof(uint16);
	if(this->meshHeader){
		oldNumMeshes = this->meshHeader->numMeshes;
		mh = (MeshHeader*)rwResize(this->meshHeader, sz, MEMDUR_EVENT | ID_GEOMETRY);
		this->meshHeader = mh;
	}else{
		oldNumMeshes = 0;
		mh = (MeshHeader*)rwNew(sz, MEMDUR_EVENT | ID_GEOMETRY);
		mh->flags = 0;
		this->meshHeader = mh;
	}
	mh->numMeshes = numMeshes;
	mh->serialNum = nextSerialNum++;
	mh->totalIndices = numIndices;
	m = mh->getMeshes();
	indices = (uint16*)&m[numMeshes];
	for(i = 0; i < mh->numMeshes; i++){
		// keep these
		if(i >= oldNumMeshes){
			m->material = nil;
			m->numIndices = 0;
		}
		// always init indices
		if(noIndices)
			m->indices = nil;
		else{
			m->indices = indices;
			indices += m->numIndices;
		}
		m++;
	}
	return mh;
}